

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  uint in_EAX;
  uint uVar1;
  uint extraout_EAX;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong __size;
  uchar uVar5;
  ulong uVar6;
  ulong uVar7;
  uchar *data;
  
  uVar5 = *keyword;
  if (uVar5 == '\0') {
    return in_EAX;
  }
  uVar7 = 0xffffffffffffffff;
  uVar3 = 0;
  uVar4 = 0;
  data = (uchar *)0x0;
  do {
    uVar6 = uVar4 + 1;
    puVar2 = data;
    __size = uVar3;
    if (uVar3 < uVar6) {
      __size = uVar6 * 3 >> 1;
      if (uVar3 * 2 < uVar6) {
        __size = uVar6;
      }
      puVar2 = (uchar *)realloc(data,__size);
      if (puVar2 != (uchar *)0x0) goto LAB_0011c65e;
    }
    else {
LAB_0011c65e:
      uVar3 = __size;
      puVar2[uVar4] = uVar5;
      uVar4 = uVar6;
      data = puVar2;
    }
    uVar5 = keyword[uVar7 + 2];
    uVar7 = uVar7 + 1;
  } while (uVar5 != '\0');
  if (0x4e < uVar7) {
    return (uint)puVar2;
  }
  uVar7 = uVar4 + 1;
  puVar2 = data;
  uVar6 = uVar3;
  if (uVar3 < uVar7) {
    uVar6 = uVar7 * 3 >> 1;
    if (uVar3 * 2 < uVar7) {
      uVar6 = uVar7;
    }
    puVar2 = (uchar *)realloc(data,uVar6);
    if (puVar2 == (uchar *)0x0) goto LAB_0011c6e3;
  }
  uVar3 = uVar6;
  puVar2[uVar4] = '\0';
  uVar4 = uVar7;
  data = puVar2;
LAB_0011c6e3:
  uVar5 = *textstring;
  do {
    if (uVar5 == '\0') {
      uVar1 = lodepng_chunk_create(&out->data,&out->size,(uint)uVar4,"tEXt",data);
      if (uVar1 == 0) {
        out->allocsize = out->size;
      }
      free(data);
      return extraout_EAX;
    }
    textstring = (char *)((uchar *)textstring + 1);
    uVar7 = uVar4 + 1;
    puVar2 = data;
    uVar6 = uVar3;
    if (uVar3 < uVar7) {
      uVar6 = uVar7 * 3 >> 1;
      if (uVar3 * 2 < uVar7) {
        uVar6 = uVar7;
      }
      puVar2 = (uchar *)realloc(data,uVar6);
      if (puVar2 != (uchar *)0x0) goto LAB_0011c731;
    }
    else {
LAB_0011c731:
      uVar3 = uVar6;
      puVar2[uVar4] = uVar5;
      uVar4 = uVar7;
      data = puVar2;
    }
    uVar5 = *textstring;
  } while( true );
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring)
{
  unsigned error = 0;
  size_t i;
  ucvector text;
  ucvector_init(&text);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&text, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&text, 0); /*0 termination char*/
  for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&text, (unsigned char)textstring[i]);
  error = addChunk(out, "tEXt", text.data, text.size);
  ucvector_cleanup(&text);

  return error;
}